

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O3

ostream * tcu::Format::operator<<
                    (ostream *str,
                    Array<tcu::Format::HexIterator<unsigned_int,_const_unsigned_int_*>_> *fmt)

{
  uint *puVar1;
  Hex<8UL> local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"{ ",2);
  puVar1 = (fmt->begin).m_iter;
  if ((fmt->end).m_iter != puVar1) {
    do {
      if (puVar1 != (fmt->begin).m_iter) {
        std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
      }
      local_30.value = (deUint64)*puVar1;
      Hex<8UL>::toStream(&local_30,str);
      puVar1 = puVar1 + 1;
    } while (puVar1 != (fmt->end).m_iter);
  }
  std::__ostream_insert<char,std::char_traits<char>>(str," }",2);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}